

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool cJSON_Compare(cJSON *a,cJSON *b,cJSON_bool case_sensitive)

{
  uint uVar1;
  uint uVar2;
  cJSON_bool cVar3;
  int iVar4;
  cJSON *pcVar5;
  cJSON *pcVar6;
  bool bVar7;
  
  if (b != (cJSON *)0x0 && a != (cJSON *)0x0) {
    uVar2 = a->type;
    bVar7 = false;
    if (((char)uVar2 == '\0') || (bVar7 = false, ((b->type ^ uVar2) & 0xff) != 0))
    goto LAB_00106271;
    uVar2 = uVar2 & 0xff;
    uVar1 = uVar2 - 1;
    if (((uVar1 < 0x40) && ((0x800000008000808bU >> ((ulong)uVar1 & 0x3f) & 1) != 0)) ||
       (uVar2 == 0x80)) {
      bVar7 = true;
      if (a == b) goto LAB_00106271;
      if (uVar2 < 0x10) {
        if ((uVar1 < 2) || (uVar2 == 4)) goto LAB_00106271;
        if (uVar2 == 8) {
          bVar7 = (bool)(-(b->valuedouble == a->valuedouble) & 1);
          goto LAB_00106271;
        }
      }
      else if (uVar2 < 0x40) {
        if (uVar2 == 0x10) {
LAB_0010635a:
          if ((a->valuestring != (char *)0x0) && (b->valuestring != (char *)0x0)) {
            iVar4 = strcmp(a->valuestring,b->valuestring);
            bVar7 = iVar4 == 0;
            goto LAB_00106271;
          }
        }
        else if (uVar2 == 0x20) {
          pcVar5 = (cJSON *)&a->child;
          pcVar6 = (cJSON *)&b->child;
          do {
            pcVar6 = pcVar6->next;
            pcVar5 = pcVar5->next;
            if ((pcVar5 == (cJSON *)0x0) || (pcVar6 == (cJSON *)0x0)) {
              bVar7 = pcVar5 == pcVar6;
              break;
            }
            cVar3 = cJSON_Compare(pcVar5,pcVar6,case_sensitive);
            bVar7 = false;
          } while (cVar3 != 0);
          goto LAB_00106271;
        }
      }
      else {
        if (uVar2 == 0x40) {
          pcVar6 = (cJSON *)&a->child;
          do {
            pcVar6 = pcVar6->next;
            if (pcVar6 == (cJSON *)0x0) {
              pcVar6 = (cJSON *)&b->child;
              goto LAB_001063c9;
            }
            pcVar5 = get_object_item(b,pcVar6->string,case_sensitive);
            if (pcVar5 == (cJSON *)0x0) goto LAB_0010626e;
            cVar3 = cJSON_Compare(pcVar6,pcVar5,case_sensitive);
            bVar7 = false;
          } while (cVar3 != 0);
          goto LAB_00106271;
        }
        if (uVar2 == 0x80) goto LAB_0010635a;
      }
    }
  }
LAB_0010626e:
  bVar7 = false;
LAB_00106271:
  return (cJSON_bool)bVar7;
  while (cVar3 = cJSON_Compare(pcVar6,pcVar5,case_sensitive), cVar3 != 0) {
LAB_001063c9:
    pcVar6 = pcVar6->next;
    bVar7 = pcVar6 == (cJSON *)0x0;
    if ((bVar7) ||
       (pcVar5 = get_object_item(a,pcVar6->string,case_sensitive), pcVar5 == (cJSON *)0x0)) break;
  }
  goto LAB_00106271;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_Compare(const cJSON * const a, const cJSON * const b, const cJSON_bool case_sensitive)
{
    if ((a == NULL) || (b == NULL) || ((a->type & 0xFF) != (b->type & 0xFF)) || cJSON_IsInvalid(a))
    {
        return false;
    }

    /* check if type is valid */
    switch (a->type & 0xFF)
    {
        case cJSON_False:
        case cJSON_True:
        case cJSON_NULL:
        case cJSON_Number:
        case cJSON_String:
        case cJSON_Raw:
        case cJSON_Array:
        case cJSON_Object:
            break;

        default:
            return false;
    }

    /* identical objects are equal */
    if (a == b)
    {
        return true;
    }

    switch (a->type & 0xFF)
    {
        /* in these cases and equal type is enough */
        case cJSON_False:
        case cJSON_True:
        case cJSON_NULL:
            return true;

        case cJSON_Number:
            if (a->valuedouble == b->valuedouble)
            {
                return true;
            }
            return false;

        case cJSON_String:
        case cJSON_Raw:
            if ((a->valuestring == NULL) || (b->valuestring == NULL))
            {
                return false;
            }
            if (strcmp(a->valuestring, b->valuestring) == 0)
            {
                return true;
            }

            return false;

        case cJSON_Array:
        {
            cJSON *a_element = a->child;
            cJSON *b_element = b->child;

            for (; (a_element != NULL) && (b_element != NULL);)
            {
                if (!cJSON_Compare(a_element, b_element, case_sensitive))
                {
                    return false;
                }

                a_element = a_element->next;
                b_element = b_element->next;
            }

            /* one of the arrays is longer than the other */
            if (a_element != b_element) {
                return false;
            }

            return true;
        }

        case cJSON_Object:
        {
            cJSON *a_element = NULL;
            cJSON *b_element = NULL;
            cJSON_ArrayForEach(a_element, a)
            {
                /* TODO This has O(n^2) runtime, which is horrible! */
                b_element = get_object_item(b, a_element->string, case_sensitive);
                if (b_element == NULL)
                {
                    return false;
                }

                if (!cJSON_Compare(a_element, b_element, case_sensitive))
                {
                    return false;
                }
            }

            /* doing this twice, once on a and b to prevent true comparison if a subset of b
             * TODO: Do this the proper way, this is just a fix for now */
            cJSON_ArrayForEach(b_element, b)
            {
                a_element = get_object_item(a, b_element->string, case_sensitive);
                if (a_element == NULL)
                {
                    return false;
                }

                if (!cJSON_Compare(b_element, a_element, case_sensitive))
                {
                    return false;
                }
            }

            return true;
        }

        default:
            return false;
    }
}